

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.cxx
# Opt level: O0

bool __thiscall nuraft::peer::recreate_rpc(peer *this,ptr<srv_config> *config,context *ctx)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  element_type *peVar4;
  size_t sVar5;
  int *piVar6;
  element_type *peVar7;
  element_type *peVar8;
  string *psVar9;
  element_type *peVar10;
  long in_RDI;
  size_t new_duration_ms;
  bool backoff_timer_disabled;
  lock_guard<std::mutex> l;
  lock_guard<std::mutex> l_1;
  ptr<rpc_client_factory> factory;
  mutex_type *in_stack_fffffffffffffe48;
  timer_helper *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  timer_helper *in_stack_fffffffffffffe60;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  string local_120 [32];
  string local_100 [32];
  undefined1 local_e0 [20];
  int local_cc;
  ulong local_c8;
  string local_c0 [39];
  byte local_99;
  undefined4 local_8c;
  string local_88 [40];
  __shared_ptr local_60 [32];
  string local_40 [63];
  byte local_1;
  
  bVar1 = std::atomic::operator_cast_to_bool
                    ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  if (bVar1) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x2a0));
    if (bVar1) {
      peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x21b015);
      iVar2 = (*peVar4->_vptr_logger[7])();
      if (5 < iVar2) {
        peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x21b03b);
        peVar8 = std::
                 __shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x21b050);
        uVar3 = srv_config::get_id(peVar8);
        msg_if_given_abi_cxx11_((char *)local_40,"peer %d is abandoned",(ulong)uVar3);
        (*peVar4->_vptr_logger[8])
                  (peVar4,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/peer.cxx"
                   ,"recreate_rpc",0xc3,local_40);
        std::__cxx11::string::~string(local_40);
      }
    }
    local_1 = 0;
  }
  else {
    std::shared_ptr<nuraft::rpc_client_factory>::shared_ptr
              ((shared_ptr<nuraft::rpc_client_factory> *)in_stack_fffffffffffffe50,
               in_stack_fffffffffffffe48);
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    std::shared_ptr<nuraft::rpc_client_factory>::operator=
              ((shared_ptr<nuraft::rpc_client_factory> *)in_stack_fffffffffffffe50,
               (shared_ptr<nuraft::rpc_client_factory> *)in_stack_fffffffffffffe48);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x21b143);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_60);
    if (bVar1) {
      std::lock_guard<std::mutex>::lock_guard
                ((lock_guard<std::mutex> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      debugging_options::get_instance();
      local_99 = std::atomic<bool>::load
                           ((atomic<bool> *)
                            CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                            (memory_order)((ulong)in_stack_fffffffffffffe50 >> 0x20));
      if (((bool)local_99) &&
         (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x2a0)), bVar1)
         ) {
        peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x21b2eb);
        iVar2 = (*peVar4->_vptr_logger[7])();
        if (5 < iVar2) {
          peVar4 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x21b31e);
          msg_if_given_abi_cxx11_((char *)local_c0,"reconnection back-off timer is disabled");
          (*peVar4->_vptr_logger[8])
                    (peVar4,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/peer.cxx"
                     ,"recreate_rpc",0xd6,local_c0);
          std::__cxx11::string::~string(local_c0);
        }
      }
      if (((local_99 & 1) != 0) ||
         (bVar1 = timer_helper::timeout
                            ((timer_helper *)
                             CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98)), bVar1))
      {
        timer_helper::reset(in_stack_fffffffffffffe60);
        sVar5 = timer_helper::get_duration_us(in_stack_fffffffffffffe60);
        local_c8 = sVar5 / 1000;
        local_cc = (int)local_c8 * 2;
        piVar6 = std::min<int>((int *)(in_RDI + 0x5c),&local_cc);
        local_c8 = (ulong)*piVar6;
        if (local_c8 == 0) {
          local_c8 = 1;
        }
        timer_helper::set_duration_ms(in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
        peVar7 = std::
                 __shared_ptr_access<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x21b4c2);
        peVar8 = std::
                 __shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x21b4d4);
        psVar9 = srv_config::get_endpoint_abi_cxx11_(peVar8);
        (*peVar7->_vptr_rpc_client_factory[2])(local_e0,peVar7,psVar9);
        std::shared_ptr<nuraft::rpc_client>::operator=
                  ((shared_ptr<nuraft::rpc_client> *)in_stack_fffffffffffffe50,
                   (shared_ptr<nuraft::rpc_client> *)in_stack_fffffffffffffe48);
        std::shared_ptr<nuraft::rpc_client>::~shared_ptr((shared_ptr<nuraft::rpc_client> *)0x21b526)
        ;
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x2a0));
        if (bVar1) {
          peVar4 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x21b557);
          iVar2 = (*peVar4->_vptr_logger[7])();
          if (5 < iVar2) {
            peVar4 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x21b58a);
            peVar10 = std::__shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>::get
                                ((__shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2> *)
                                 (in_RDI + 0x20));
            peVar8 = std::
                     __shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x21b5b2);
            uVar3 = srv_config::get_id(peVar8);
            msg_if_given_abi_cxx11_((char *)local_100,"%p reconnect peer %d",peVar10,(ulong)uVar3);
            (*peVar4->_vptr_logger[8])
                      (peVar4,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/peer.cxx"
                       ,"recreate_rpc",0xe3,local_100);
            std::__cxx11::string::~string(local_100);
          }
        }
        reset_active_timer((peer *)0x21b654);
        set_free((peer *)0x21b663);
        set_manual_free((peer *)0x21b672);
        local_1 = 1;
      }
      else {
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x2a0));
        if (bVar1) {
          peVar4 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x21b6bd);
          iVar2 = (*peVar4->_vptr_logger[7])();
          if (5 < iVar2) {
            peVar4 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x21b6f0);
            msg_if_given_abi_cxx11_((char *)local_120,"skip reconnect this time");
            (*peVar4->_vptr_logger[8])
                      (peVar4,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/peer.cxx"
                       ,"recreate_rpc",0xef,local_120);
            std::__cxx11::string::~string(local_120);
          }
        }
        local_1 = 0;
      }
      local_8c = 1;
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x21b792);
    }
    else {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x2a0));
      if (bVar1) {
        peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x21b189);
        iVar2 = (*peVar4->_vptr_logger[7])();
        if (5 < iVar2) {
          peVar4 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x21b1bc);
          msg_if_given_abi_cxx11_((char *)local_88,"client factory is empty");
          (*peVar4->_vptr_logger[8])
                    (peVar4,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/peer.cxx"
                     ,"recreate_rpc",0xcc,local_88);
          std::__cxx11::string::~string(local_88);
        }
      }
      local_1 = 0;
      local_8c = 1;
    }
    std::shared_ptr<nuraft::rpc_client_factory>::~shared_ptr
              ((shared_ptr<nuraft::rpc_client_factory> *)0x21b7b0);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool peer::recreate_rpc(ptr<srv_config>& config,
                        context& ctx)
{
    if (abandoned_) {
        p_tr("peer %d is abandoned", config->get_id());
        return false;
    }

    ptr<rpc_client_factory> factory = nullptr;
    {   std::lock_guard<std::mutex> l(ctx.ctx_lock_);
        factory = ctx.rpc_cli_factory_;
    }
    if (!factory) {
        p_tr("client factory is empty");
        return false;
    }

    std::lock_guard<std::mutex> l(rpc_protector_);

    bool backoff_timer_disabled =
        debugging_options::get_instance()
        .disable_reconn_backoff_.load(std::memory_order_relaxed);
    if (backoff_timer_disabled) {
        p_tr("reconnection back-off timer is disabled");
    }

    // To avoid too frequent reconnection attempt,
    // we use exponential backoff (x2) from 1 ms to heartbeat interval.
    if (backoff_timer_disabled || reconn_backoff_.timeout()) {
        reconn_backoff_.reset();
        size_t new_duration_ms = reconn_backoff_.get_duration_us() / 1000;
        new_duration_ms = std::min( hb_interval_, (int32)new_duration_ms * 2 );
        if (!new_duration_ms) new_duration_ms = 1;
        reconn_backoff_.set_duration_ms(new_duration_ms);

        rpc_ = factory->create_client(config->get_endpoint());
        p_tr("%p reconnect peer %d", rpc_.get(), config_->get_id());

        // WARNING:
        //   A reconnection attempt should be treated as an activity,
        //   hence reset timer.
        reset_active_timer();

        set_free();
        set_manual_free();
        return true;

    } else {
        p_tr("skip reconnect this time");
    }
    return false;
}